

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockSingleNestedStructArrayCase::init
          (BlockSingleNestedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_> *this_00;
  ShaderInterface *this_01;
  deUint32 extraout_EAX;
  deUint32 dVar1;
  StructType *this_02;
  StructType *this_03;
  BufferBlock *this_04;
  VarType VStack_98;
  BufferVar local_80;
  VarType local_40;
  
  this_01 = &(this->super_SSBOLayoutCase).m_interface;
  this_02 = bb::ShaderInterface::allocStruct(this_01,"S");
  glu::VarType::VarType((VarType *)&local_80,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"a",(VarType *)&local_80);
  glu::VarType::~VarType((VarType *)&local_80);
  glu::VarType::VarType(&VStack_98,TYPE_INT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&local_80,&VStack_98,4);
  glu::StructType::addMember(this_02,"b",(VarType *)&local_80);
  glu::VarType::~VarType((VarType *)&local_80);
  glu::VarType::~VarType(&VStack_98);
  glu::VarType::VarType((VarType *)&local_80,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"c",(VarType *)&local_80);
  glu::VarType::~VarType((VarType *)&local_80);
  this_03 = bb::ShaderInterface::allocStruct(this_01,"T");
  glu::VarType::VarType((VarType *)&local_80,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::StructType::addMember(this_03,"a",(VarType *)&local_80);
  glu::VarType::~VarType((VarType *)&local_80);
  glu::VarType::VarType(&VStack_98,this_02);
  glu::VarType::VarType((VarType *)&local_80,&VStack_98,3);
  glu::StructType::addMember(this_03,"b",(VarType *)&local_80);
  glu::VarType::~VarType((VarType *)&local_80);
  glu::VarType::~VarType(&VStack_98);
  this_04 = bb::ShaderInterface::allocBlock(this_01,"Block");
  glu::VarType::VarType(&VStack_98,this_02);
  bb::BufferVar::BufferVar(&local_80,"s",&VStack_98,0x1000);
  this_00 = &this_04->m_variables;
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_80);
  bb::BufferVar::~BufferVar(&local_80);
  glu::VarType::~VarType(&VStack_98);
  glu::VarType::VarType(&VStack_98,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_80,"v",&VStack_98,0);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_80);
  bb::BufferVar::~BufferVar(&local_80);
  glu::VarType::~VarType(&VStack_98);
  glu::VarType::VarType(&local_40,this_03);
  glu::VarType::VarType(&VStack_98,&local_40,2);
  bb::BufferVar::BufferVar(&local_80,"t",&VStack_98,0x800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_80);
  bb::BufferVar::~BufferVar(&local_80);
  glu::VarType::~VarType(&VStack_98);
  glu::VarType::~VarType(&local_40);
  glu::VarType::VarType(&VStack_98,TYPE_UINT,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_80,"u",&VStack_98,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_80);
  bb::BufferVar::~BufferVar(&local_80);
  glu::VarType::~VarType(&VStack_98);
  dVar1 = this->m_layoutFlags;
  this_04->m_flags = dVar1;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&this_04->m_instanceName);
    bb::BufferBlock::setArraySize(this_04,this->m_numInstances);
    dVar1 = extraout_EAX;
  }
  return dVar1;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP));
		typeT.addMember("b", VarType(VarType(&typeS), 3));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_WRITE));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("t", VarType(VarType(&typeT), 2), ACCESS_READ));
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}